

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall pstore::stdout_logger::~stdout_logger(stdout_logger *this)

{
  (this->super_file_logger).super_basic_logger.super_logger._vptr_logger =
       (_func_int **)&PTR__basic_logger_001b5698;
  std::__cxx11::string::~string
            ((string *)&(this->super_file_logger).super_basic_logger.thread_name_);
  logger::~logger((logger *)this);
  return;
}

Assistant:

stdout_logger::~stdout_logger () noexcept = default;